

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O0

double matd_vec_mag(matd_t *a)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  double dVar4;
  int local_20;
  int i;
  int len;
  double mag;
  matd_t *a_local;
  
  if (a == (matd_t *)0x0) {
    __assert_fail("a != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x34c,"double matd_vec_mag(const matd_t *)");
  }
  iVar3 = matd_is_vector(a);
  if (iVar3 != 0) {
    _i = 0.0;
    uVar1 = a->nrows;
    uVar2 = a->ncols;
    for (local_20 = 0; local_20 < (int)(uVar1 * uVar2); local_20 = local_20 + 1) {
      dVar4 = sq((double)a[(long)local_20 + 1]);
      _i = dVar4 + _i;
    }
    dVar4 = sqrt(_i);
    return dVar4;
  }
  __assert_fail("matd_is_vector(a)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                ,0x34d,"double matd_vec_mag(const matd_t *)");
}

Assistant:

double matd_vec_mag(const matd_t *a)
{
    assert(a != NULL);
    assert(matd_is_vector(a));

    double mag = 0.0;
    int len = a->nrows*a->ncols;
    for (int i = 0; i < len; i++)
        mag += sq(a->data[i]);
    return sqrt(mag);
}